

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O2

int __thiscall
Fl_Pixmap::prepare(Fl_Pixmap *this,int XP,int YP,int WP,int HP,int *cx,int *cy,int *X,int *Y,int *W,
                  int *H)

{
  uint uVar1;
  uint uVar2;
  Window WVar3;
  int iVar4;
  uint uVar5;
  Fl_Surface_Device *pFVar6;
  Fl_Display_Device *pFVar7;
  Fl_Bitmask FVar8;
  int iVar9;
  int iVar10;
  uchar *bitmap;
  
  uVar5 = (this->super_Fl_Image).w_;
  if ((int)uVar5 < 0) {
    measure(this);
    uVar5 = (this->super_Fl_Image).w_;
  }
  if ((uVar5 == 0) || ((this->super_Fl_Image).data_ == (char **)0x0)) {
    Fl_Image::draw_empty(&this->super_Fl_Image,XP,YP);
    iVar4 = 1;
  }
  else {
    uVar1 = (this->super_Fl_Image).h_;
    uVar2 = WP;
    if (WP == -1) {
      uVar2 = uVar5;
    }
    if (WP == -1) {
      HP = uVar1;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
              (fl_graphics_driver,(ulong)(uint)XP,(ulong)(uint)YP,(ulong)uVar2,(ulong)(uint)HP,X,Y,W
               ,H);
    *cx = *cx + (*X - XP);
    *cy = *cy + (*Y - YP);
    iVar4 = *cx;
    if (iVar4 < 0) {
      *W = *W + iVar4;
      *X = *X - *cx;
      *cx = 0;
      iVar4 = 0;
    }
    iVar10 = *W;
    if ((int)uVar5 < iVar10 + iVar4) {
      iVar10 = uVar5 - iVar4;
      *W = iVar10;
    }
    iVar4 = 1;
    if (0 < iVar10) {
      iVar10 = *cy;
      if (iVar10 < 0) {
        *H = *H + iVar10;
        *Y = *Y - *cy;
        *cy = 0;
        iVar10 = 0;
      }
      iVar9 = *H;
      if ((int)uVar1 < iVar9 + iVar10) {
        iVar9 = uVar1 - iVar10;
        *H = iVar9;
      }
      if ((0 < iVar9) && (iVar4 = 0, this->id_ == 0)) {
        uVar5 = XCreatePixmap(fl_display,
                              *(undefined8 *)
                               (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                              (this->super_Fl_Image).w_,(this->super_Fl_Image).h_,fl_visual->depth);
        this->id_ = uVar5;
        WVar3 = fl_window;
        fl_window = (Window)uVar5;
        pFVar6 = Fl_Surface_Device::surface();
        pFVar7 = Fl_Display_Device::display_device();
        (*(pFVar7->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar7);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
        fl_mask_bitmap = &bitmap;
        bitmap = (uchar *)0x0;
        iVar4 = 0;
        fl_draw_pixmap((this->super_Fl_Image).data_,0,0,0x38);
        fl_mask_bitmap = (uchar **)0x0;
        if (bitmap != (uchar *)0x0) {
          FVar8 = fl_create_bitmask((this->super_Fl_Image).w_,(this->super_Fl_Image).h_,bitmap);
          this->mask_ = (uint)FVar8;
          if (bitmap != (uchar *)0x0) {
            operator_delete__(bitmap);
          }
        }
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
        fl_window = WVar3;
        (*(pFVar6->super_Fl_Device)._vptr_Fl_Device[3])(pFVar6);
      }
    }
  }
  return iVar4;
}

Assistant:

int Fl_Pixmap::prepare(int XP, int YP, int WP, int HP, int &cx, int &cy,
			   int &X, int &Y, int &W, int &H) {
  if (w() < 0) measure();
  int code = start(this, XP, YP, WP, HP, w(), h(), cx, cy, X, Y, W, H);
  if (code) {
    if (code == 2) draw_empty(XP, YP);
    return 1;
  }
  if (!id_) {
#ifdef __APPLE__
    id_ = Fl_Quartz_Graphics_Driver::create_offscreen_with_alpha(w(), h());
#else
    id_ = fl_create_offscreen(w(), h());
#endif
    fl_begin_offscreen((Fl_Offscreen)id_);
#ifndef __APPLE__
    uchar *bitmap = 0;
    fl_mask_bitmap = &bitmap;
#endif
    fl_draw_pixmap(data(), 0, 0, FL_BLACK);
#ifndef __APPLE__
#if defined(WIN32)
    extern UINT win_pixmap_bg_color; // computed by fl_draw_pixmap()
    this->pixmap_bg_color = win_pixmap_bg_color;
#endif
    fl_mask_bitmap = 0;
    if (bitmap) {
      mask_ = fl_create_bitmask(w(), h(), bitmap);
      delete[] bitmap;
    }
#endif
    fl_end_offscreen();
  }
  return 0;
}